

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O0

void __thiscall
DHUDMessageTypeOnFadeOut::DoDraw
          (DHUDMessageTypeOnFadeOut *this,int linenum,int x,int y,bool clean,int hudheight)

{
  EColorRange EVar1;
  FFont *pFVar2;
  DFrameBuffer *pDVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  int hudheight_local;
  bool clean_local;
  int y_local;
  int x_local;
  int linenum_local;
  DHUDMessageTypeOnFadeOut *this_local;
  
  pDVar3 = screen;
  if ((this->super_DHUDMessageFadeOut).super_DHUDMessage.State == 3) {
    if (linenum < this->CurrLine) {
      DHUDMessage::DoDraw((DHUDMessage *)this,linenum,x,y,clean,hudheight);
    }
    else if (linenum == this->CurrLine) {
      if (hudheight == 0) {
        iVar4 = active_con_scaletext();
        pDVar3 = screen;
        if (iVar4 < 2) {
          pFVar2 = (this->super_DHUDMessageFadeOut).super_DHUDMessage.Font;
          EVar1 = (this->super_DHUDMessageFadeOut).super_DHUDMessage.TextColor;
          pcVar8 = FString::operator_cast_to_char_
                             (&(this->super_DHUDMessageFadeOut).super_DHUDMessage.Lines[linenum].
                               Text);
          DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,EVar1,x,y,pcVar8,0x40001393,
                            (this->super_DHUDMessageFadeOut).super_DHUDMessage.Alpha,(uint)clean,
                            0x400013b7,this->LineVisible,0x4000138c,0x400013a9,
                            (this->super_DHUDMessageFadeOut).super_DHUDMessage.Style.AsDWORD,0);
        }
        else {
          pFVar2 = (this->super_DHUDMessageFadeOut).super_DHUDMessage.Font;
          EVar1 = (this->super_DHUDMessageFadeOut).super_DHUDMessage.TextColor;
          pcVar8 = FString::operator_cast_to_char_
                             (&(this->super_DHUDMessageFadeOut).super_DHUDMessage.Lines[linenum].
                               Text);
          iVar4 = DCanvas::GetWidth((DCanvas *)screen);
          iVar5 = active_con_scaletext();
          iVar6 = DCanvas::GetHeight((DCanvas *)screen);
          iVar7 = active_con_scaletext();
          DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,EVar1,x,y,pcVar8,0x40001399,
                            (this->super_DHUDMessageFadeOut).super_DHUDMessage.Alpha,iVar4 / iVar5,
                            0x4000139a,iVar6 / iVar7,0x400013a8,1,0x400013b7,this->LineVisible,
                            0x4000138c,0x400013a9,
                            (this->super_DHUDMessageFadeOut).super_DHUDMessage.Style.AsDWORD,0);
        }
      }
      else {
        pFVar2 = (this->super_DHUDMessageFadeOut).super_DHUDMessage.Font;
        EVar1 = (this->super_DHUDMessageFadeOut).super_DHUDMessage.TextColor;
        pcVar8 = FString::operator_cast_to_char_
                           (&(this->super_DHUDMessageFadeOut).super_DHUDMessage.Lines[linenum].Text)
        ;
        DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,EVar1,x,y,pcVar8,0x40001399,
                          (this->super_DHUDMessageFadeOut).super_DHUDMessage.Alpha,
                          (this->super_DHUDMessageFadeOut).super_DHUDMessage.HUDWidth,0x4000139a,
                          hudheight,0x400013a3,
                          (this->super_DHUDMessageFadeOut).super_DHUDMessage.ClipLeft,0x400013a4,
                          (this->super_DHUDMessageFadeOut).super_DHUDMessage.ClipRight,0x400013a1,
                          (this->super_DHUDMessageFadeOut).super_DHUDMessage.ClipTop,0x400013a2,
                          (this->super_DHUDMessageFadeOut).super_DHUDMessage.ClipBot,0x4000138c,
                          0x400013b7,this->LineVisible,0x400013a9,
                          (this->super_DHUDMessageFadeOut).super_DHUDMessage.Style.AsDWORD,0);
      }
    }
  }
  else {
    DHUDMessageFadeOut::DoDraw(&this->super_DHUDMessageFadeOut,linenum,x,y,clean,hudheight);
  }
  return;
}

Assistant:

void DHUDMessageTypeOnFadeOut::DoDraw (int linenum, int x, int y, bool clean, int hudheight)
{
	if (State == 3)
	{
		if (linenum < CurrLine)
		{
			DHUDMessage::DoDraw (linenum, x, y, clean, hudheight);
		}
		else if (linenum == CurrLine)
		{
			if (hudheight == 0)
			{
				if (active_con_scaletext() <= 1)
				{
					screen->DrawText (Font, TextColor, x, y, Lines[linenum].Text,
						DTA_CleanNoMove, clean,
						DTA_TextLen, LineVisible,
						DTA_AlphaF, Alpha,
						DTA_RenderStyle, Style,
						TAG_DONE);
				}
				else
				{
					screen->DrawText (Font, TextColor, x, y, Lines[linenum].Text,
						DTA_VirtualWidth, SCREENWIDTH / active_con_scaletext(),
						DTA_VirtualHeight, SCREENHEIGHT / active_con_scaletext(),
						DTA_KeepRatio, true,
						DTA_TextLen, LineVisible,
						DTA_AlphaF, Alpha,
						DTA_RenderStyle, Style,
						TAG_DONE);
				}
			}
			else
			{
				screen->DrawText (Font, TextColor, x, y, Lines[linenum].Text,
					DTA_VirtualWidth, HUDWidth,
					DTA_VirtualHeight, hudheight,
					DTA_ClipLeft, ClipLeft,
					DTA_ClipRight, ClipRight,
					DTA_ClipTop, ClipTop,
					DTA_ClipBottom, ClipBot,
					DTA_AlphaF, Alpha,
					DTA_TextLen, LineVisible,
					DTA_RenderStyle, Style,
					TAG_DONE);
			}
		}
	}
	else
	{
		DHUDMessageFadeOut::DoDraw (linenum, x, y, clean, hudheight);
	}
}